

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O3

void __thiscall minibag::Bag::decompressLz4Chunk(Bag *this,ChunkHeader *chunk_header)

{
  Buffer *this_00;
  element_type *peVar1;
  uint32_t dest_len;
  uint32_t source_len;
  uint8_t *dest;
  uint8_t *source;
  Buffer *this_01;
  
  miniros_console_bridge::log
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/rosbag_storage/bag.cpp"
             ,0x3a4,CONSOLE_BRIDGE_LOG_DEBUG,"lz4 compressed_size: %d uncompressed_size: %d",
             (ulong)chunk_header->compressed_size,(ulong)chunk_header->uncompressed_size);
  peVar1 = (this->encryptor_).super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this_00 = &this->chunk_buffer_;
  (*peVar1->_vptr_EncryptorBase[4])(peVar1,chunk_header,this_00,&this->file_);
  this_01 = &this->decompress_buffer_;
  Buffer::setSize(this_01,chunk_header->uncompressed_size);
  dest = Buffer::getData(this_01);
  dest_len = Buffer::getSize(this_01);
  source = Buffer::getData(this_00);
  source_len = Buffer::getSize(this_00);
  ChunkedFile::decompress(&this->file_,LZ4,dest,dest_len,source,source_len);
  return;
}

Assistant:

void Bag::decompressLz4Chunk(ChunkHeader const& chunk_header) const {
    assert(chunk_header.compression == COMPRESSION_LZ4);

    CompressionType compression = compression::LZ4;

    MINIROS_CONSOLE_BRIDGE_logDebug("lz4 compressed_size: %d uncompressed_size: %d",
             chunk_header.compressed_size, chunk_header.uncompressed_size);

    encryptor_->decryptChunk(chunk_header, chunk_buffer_, file_);

    decompress_buffer_.setSize(chunk_header.uncompressed_size);
    file_.decompress(compression, decompress_buffer_.getData(), decompress_buffer_.getSize(), chunk_buffer_.getData(), chunk_buffer_.getSize());

    // todo check read was successful
}